

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

void __thiscall icu_63::ResourceBundle::ResourceBundle(ResourceBundle *this,UErrorCode *err)

{
  Locale *this_00;
  char *localeID;
  UResourceBundle *pUVar1;
  UErrorCode *err_local;
  ResourceBundle *this_local;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)0x0;
  UObject::UObject(&this->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__ResourceBundle_004ad5c0;
  this->fLocale = (Locale *)0x0;
  this_00 = Locale::getDefault();
  localeID = Locale::getName(this_00);
  pUVar1 = ures_open_63((char *)0x0,localeID,err);
  this->fResource = pUVar1;
  return;
}

Assistant:

ResourceBundle::ResourceBundle(UErrorCode &err)
                                :UObject(), fLocale(NULL)
{
    fResource = ures_open(0, Locale::getDefault().getName(), &err);
}